

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator
fmt::v9::detail::write_escaped_cp<fmt::v9::detail::counting_iterator,char>
          (counting_iterator out,find_escape_result<char> *escape)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  char *pcVar6;
  char *pcVar7;
  char buf [2];
  char cStack_6;
  char acStack_5 [5];
  
  uVar3 = escape->cp;
  uVar4 = (ulong)uVar3;
  if (((0x27 < uVar4) || ((0x8400002600U >> (uVar4 & 0x3f) & 1) == 0)) && (uVar3 != 0x5c)) {
    if (uVar3 < 0x100) {
      pcVar7 = buf + 1;
      pcVar6 = &cStack_6;
      do {
        uVar3 = (uint)uVar4;
        *pcVar7 = "0123456789abcdef"[uVar3 & 0xf];
        uVar4 = uVar4 >> 4;
        pcVar7 = pcVar7 + -1;
      } while (0xf < uVar3);
    }
    else if (uVar3 < 0x10000) {
      pcVar7 = acStack_5;
      pcVar6 = acStack_5 + 1;
      do {
        uVar3 = (uint)uVar4;
        *pcVar7 = "0123456789abcdef"[uVar3 & 0xf];
        uVar4 = uVar4 >> 4;
        pcVar7 = pcVar7 + -1;
      } while (0xf < uVar3);
    }
    else {
      if (0x10ffff < uVar3) {
        pbVar5 = (byte *)escape->begin;
        pbVar1 = (byte *)escape->end;
        if (pbVar5 == pbVar1) {
          return (counting_iterator)out.count_;
        }
        do {
          pcVar7 = buf + 1;
          uVar3 = (uint)*pbVar5;
          do {
            *pcVar7 = "0123456789abcdef"[uVar3 & 0xf];
            pcVar7 = pcVar7 + -1;
            bVar2 = 0xf < uVar3;
            uVar3 = uVar3 >> 4;
          } while (bVar2);
          out.count_ = out.count_ + 4;
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != pbVar1);
        return (counting_iterator)out.count_;
      }
      pcVar7 = acStack_5 + 4;
      do {
        uVar3 = (uint)uVar4;
        *pcVar7 = "0123456789abcdef"[uVar3 & 0xf];
        uVar4 = uVar4 >> 4;
        pcVar7 = pcVar7 + -1;
        pcVar6 = (char *)register0x00000020;
      } while (0xf < uVar3);
    }
    return (counting_iterator)((long)pcVar6 + (out.count_ - (long)buf) + 2);
  }
  return (counting_iterator)(out.count_ + 2);
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (is_utf8()) {
      if (escape.cp < 0x100) {
        return write_codepoint<2, Char>(out, 'x', escape.cp);
      }
      if (escape.cp < 0x10000) {
        return write_codepoint<4, Char>(out, 'u', escape.cp);
      }
      if (escape.cp < 0x110000) {
        return write_codepoint<8, Char>(out, 'U', escape.cp);
      }
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}